

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_diff.hpp
# Opt level: O0

Diffs * __thiscall
MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
diff_bisectSplit(Diffs *__return_storage_ptr__,
                MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *this,Range text1,Range text2,int x,int y,Time deadline)

{
  iterator __first;
  iterator __last;
  Range text1_00;
  Range text2_00;
  Range text1_01;
  Range text2_01;
  __normal_iterator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff_*,_std::vector<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>_>
  local_110;
  const_iterator local_108;
  duration local_f0;
  char *local_e8;
  char *pcStack_e0;
  char *local_d8;
  char *pcStack_d0;
  undefined1 local_c8 [8];
  Diffs diffsb;
  ConstIter CStack_80;
  Range text2b;
  Range text1b;
  Range text2a;
  Range text1a;
  MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  Time deadline_local;
  Range text2_local;
  Range text1_local;
  Diffs *diffs;
  
  text2_local.from = text2.till._M_current;
  deadline_local.__d.__r = (duration)text2.from._M_current;
  text2_local.till = text1.from._M_current;
  text1_00 = Range::substr((Range *)&text2_local.till,0,(long)x);
  text2_00 = Range::substr((Range *)&deadline_local,0,(long)y);
  text1_01 = Range::substr((Range *)&text2_local.till,(long)x);
  text2_01 = Range::substr((Range *)&deadline_local,(long)y);
  diffsb.
  super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)deadline.__d.__r;
  diff_main(__return_storage_ptr__,this,text1_00,text2_00,deadline);
  text2b.till = text1_01.from._M_current;
  text1b.from = text1_01.till._M_current;
  local_d8 = text2b.till._M_current;
  pcStack_d0 = text1b.from._M_current;
  CStack_80 = text2_01.from._M_current;
  text2b.from = text2_01.till._M_current;
  local_e8 = CStack_80._M_current;
  pcStack_e0 = text2b.from._M_current;
  local_f0 = deadline.__d.__r;
  diff_main((Diffs *)local_c8,this,text1_01,text2_01,deadline);
  local_110._M_current =
       (Diff *)std::
               vector<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
               ::end(__return_storage_ptr__);
  __gnu_cxx::
  __normal_iterator<MyersDiff<std::__cxx11::string>::Diff_const*,std::vector<MyersDiff<std::__cxx11::string>::Diff,std::allocator<MyersDiff<std::__cxx11::string>::Diff>>>
  ::__normal_iterator<MyersDiff<std::__cxx11::string>::Diff*>
            ((__normal_iterator<MyersDiff<std::__cxx11::string>::Diff_const*,std::vector<MyersDiff<std::__cxx11::string>::Diff,std::allocator<MyersDiff<std::__cxx11::string>::Diff>>>
              *)&local_108,&local_110);
  __first = std::
            vector<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
            ::begin((vector<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
                     *)local_c8);
  __last = std::
           vector<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
           ::end((vector<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
                  *)local_c8);
  std::
  vector<MyersDiff<std::__cxx11::string>::Diff,std::allocator<MyersDiff<std::__cxx11::string>::Diff>>
  ::
  insert<__gnu_cxx::__normal_iterator<MyersDiff<std::__cxx11::string>::Diff*,std::vector<MyersDiff<std::__cxx11::string>::Diff,std::allocator<MyersDiff<std::__cxx11::string>::Diff>>>,void>
            ((vector<MyersDiff<std::__cxx11::string>::Diff,std::allocator<MyersDiff<std::__cxx11::string>::Diff>>
              *)__return_storage_ptr__,local_108,
             (__normal_iterator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff_*,_std::vector<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>_>
              )__first._M_current,
             (__normal_iterator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff_*,_std::vector<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>_>
              )__last._M_current);
  std::
  vector<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
  ::~vector((vector<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
             *)local_c8);
  return __return_storage_ptr__;
}

Assistant:

Diffs diff_bisectSplit(Range text1, Range text2, int x, int y,
                           Time deadline) {
        Range text1a = text1.substr(0, x);
        Range text2a = text2.substr(0, y);
        Range text1b = text1.substr(x);
        Range text2b = text2.substr(y);

        // Compute both diffs serially.
        Diffs diffs = diff_main(text1a, text2a, deadline);
        Diffs diffsb = diff_main(text1b, text2b, deadline);

        diffs.insert(diffs.end(), diffsb.begin(), diffsb.end());
        return diffs;
    }